

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLatestDataFromThreadSBGx(SBG *pSBG,SBGDATA *pSBGData)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  SBGDATA *pSBGData_local;
  SBG *pSBG_local;
  
  local_24 = 0;
  do {
    if ((SBG *)addrsSBG[local_24] == pSBG) {
      EnterCriticalSection(SBGCS + local_24);
      memcpy(pSBGData,sbgdataSBG + local_24,0x11b0);
      iVar1 = resSBG[local_24];
      LeaveCriticalSection(SBGCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadSBGx(SBG* pSBG, SBGDATA* pSBGData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&SBGCS[id]);
	*pSBGData = sbgdataSBG[id];
	res = resSBG[id];
	LeaveCriticalSection(&SBGCS[id]);

	return res;
}